

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.h
# Opt level: O0

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       *this)

{
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_RDI;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_00000028;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_000000f8;
  undefined3 uVar1;
  token_type in_stack_ffffffffffffffe4;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  token_type tVar2;
  
  this_00 = in_RDI;
  do {
    get(this_00);
    uVar1 = (undefined3)in_stack_ffffffffffffffe4;
    in_stack_ffffffffffffffe4 = CONCAT13(1,uVar1);
    if (((in_RDI->current != 0x20) &&
        (in_stack_ffffffffffffffe4 = CONCAT13(1,uVar1), in_RDI->current != 9)) &&
       (in_stack_ffffffffffffffe4 = CONCAT13(1,uVar1), in_RDI->current != 10)) {
      in_stack_ffffffffffffffe4 = CONCAT13(in_RDI->current == 0xd,uVar1);
    }
  } while ((char)(in_stack_ffffffffffffffe4 >> 0x18) != '\0');
  switch(in_RDI->current) {
  default:
    in_RDI->error_message = "invalid literal";
    tVar2 = parse_error;
    break;
  case 0x22:
    tVar2 = scan_string(in_stack_000000f8);
    break;
  case 0x2c:
    tVar2 = value_separator;
    break;
  case 0x2d:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    tVar2 = scan_number(in_stack_00000028);
    break;
  case 0x3a:
    tVar2 = name_separator;
    break;
  case 0x5b:
    tVar2 = begin_array;
    break;
  case 0x5d:
    tVar2 = end_array;
    break;
  case 0x66:
    tVar2 = scan_literal((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (char *)this_00,(size_t)in_RDI,in_stack_ffffffffffffffe4);
    break;
  case 0x6e:
    tVar2 = scan_literal((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (char *)this_00,(size_t)in_RDI,in_stack_ffffffffffffffe4);
    break;
  case 0x74:
    tVar2 = scan_literal((lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                          *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         (char *)this_00,(size_t)in_RDI,in_stack_ffffffffffffffe4);
    break;
  case 0x7b:
    tVar2 = begin_object;
    break;
  case 0x7d:
    tVar2 = end_object;
    break;
  case -1:
  case 0:
    tVar2 = end_of_input;
  }
  return tVar2;
}

Assistant:

token_type scan()
{
// read next character and ignore whitespace
do
{
get();
}
while (current == ' ' or current == '\t' or current == '\n' or current == '\r');

switch (current)
{
// structural characters
case '[':
return token_type::begin_array;
case ']':
return token_type::end_array;
case '{':
return token_type::begin_object;
case '}':
return token_type::end_object;
case ':':
return token_type::name_separator;
case ',':
return token_type::value_separator;

// literals
case 't':
return scan_literal("true", 4, token_type::literal_true);
case 'f':
return scan_literal("false", 5, token_type::literal_false);
case 'n':
return scan_literal("null", 4, token_type::literal_null);

// string
case '\"':
return scan_string();

// number
case '-':
case '0':
case '1':
case '2':
case '3':
case '4':
case '5':
case '6':
case '7':
case '8':
case '9':
return scan_number();

// end of input (the null byte is needed when parsing from
// string literals)
case '\0':
case std::char_traits<char>::eof():
return token_type::end_of_input;

// error
default:
error_message = "invalid literal";
return token_type::parse_error;
}
}